

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O2

void __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::cow_guarded<int>
          (cow_guarded<int,_std::timed_mutex> *this,int *data)

{
  shared_ptr<int> local_20;
  
  std::make_shared<int,int>((int *)&local_20);
  lr_guarded<std::shared_ptr<int_const>,std::mutex>::lr_guarded<std::shared_ptr<int>>
            ((lr_guarded<std::shared_ptr<int_const>,std::mutex> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  *(undefined8 *)((long)&(this->m_writeMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_writeMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

cow_guarded<T, M>::cow_guarded(Us&&... data):
    m_data(std::make_shared<T>(std::forward<Us>(data)...))
{
}